

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
::
find<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,capnp::StructSchema&>
          (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
                 table,StructSchema *params)

{
  int iVar1;
  RawBrandedSchema *pRVar2;
  Disposer *pDVar3;
  bool bVar4;
  uint uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  uint hash;
  Entry *this_00;
  StructSchema *in_R8;
  AnnotatedHandler *pAVar8;
  Maybe<unsigned_long> MVar9;
  ulong uVar6;
  
  this_00 = table.ptr;
  pAVar8 = (this_00->value).ptr.ptr;
  aVar7.value = table.size_;
  if (pAVar8 != (AnnotatedHandler *)0x0) {
    pRVar2 = (in_R8->super_Schema).raw;
    hash = (uint)((int)((ulong)pRVar2 >> 0x20) * 0xbfe3 + (int)pRVar2 != 0);
    uVar5 = kj::_::chooseBucket(hash,(uint)pAVar8);
    uVar6 = (ulong)uVar5;
    aVar7 = extraout_RDX;
    while( true ) {
      pDVar3 = (this_00->value).ptr.disposer;
      iVar1 = *(int *)((long)&pDVar3[uVar6]._vptr_Disposer + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)&pDVar3[uVar6]._vptr_Disposer == hash)) &&
         (bVar4 = HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
                  Callbacks::matches<capnp::StructSchema&>
                            ((Callbacks *)this_00,(Entry *)((ulong)(iVar1 - 2) * 0x20 + table.size_)
                             ,in_R8), aVar7 = extraout_RDX_00, bVar4)) {
        iVar1 = *(int *)((long)&pDVar3[uVar6]._vptr_Disposer + 4);
        *this = (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_00233c30;
      }
      pAVar8 = (AnnotatedHandler *)(uVar6 + 1);
      uVar6 = 0;
      if (pAVar8 != (this_00->value).ptr.ptr) {
        uVar6 = (ulong)pAVar8 & 0xffffffff;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           )0x0;
LAB_00233c30:
  MVar9.ptr.field_1.value = aVar7.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }